

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O2

int beMsgGetListStrings(be_node *n,
                       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *values)

{
  be_node *node;
  uint uVar1;
  long lVar2;
  be_node *val;
  string str;
  value_type local_50;
  
  uVar1 = 0;
  if (n->type == BE_LIST) {
    lVar2 = 0;
    while ((node = *(be_node **)((n->val).s + lVar2), node != (be_node *)0x0 &&
           (node->type == BE_STR))) {
      be_str_len(node);
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::append((char *)&local_50,(node->val).i);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(values,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lVar2 = lVar2 + 8;
    }
    uVar1 = (uint)(node == (be_node *)0x0);
  }
  return uVar1;
}

Assistant:

int beMsgGetListStrings(be_node *n, std::list<std::string> &values) {
	if (n->type != BE_LIST) {
		return 0;
	}
	for (int i = 0; n->val.l[i] != NULL; i++) {
		be_node *val = n->val.l[i];

		if (val == NULL || val->type != BE_STR)	
			return 0;

		int len = be_str_len(val);
		std::string str;
		str.append(val->val.s, len);
		values.push_back(str);
	}
        return 1;
}